

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int MRIStepWriteParameters(void *arkode_mem,FILE *fp)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_28;
  ARKodeMRIStepMem local_20;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepWriteParameters",&local_28,&local_20);
  if (iVar1 == 0) {
    iVar1 = arkWriteParameters((ARKodeMem)arkode_mem,fp);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      arkProcessError(local_28,-0x15,"ARKode::MRIStep","MRIStepWriteParameters",
                      "Error writing ARKode infrastructure parameters");
    }
  }
  return iVar1;
}

Assistant:

int MRIStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* output ARKode infrastructure parameters first */
  retval = arkWriteParameters(arkode_mem, fp);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(retval);
  }

  return(ARK_SUCCESS);
}